

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rsi.c
# Opt level: O3

ErrorNumber test_func_rsi(TA_History *history)

{
  TA_RetCode TVar1;
  TA_TestId TVar2;
  ErrorNumber EVar3;
  ulong uVar4;
  ulong uVar5;
  TA_FuncUnstId TVar6;
  char *name;
  TA_Test_conflict12 *pTVar7;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_FuncHandle *funcHandle;
  TA_RangeTestParam_conflict15 testParam;
  TA_FuncInfo *funcInfo;
  uint local_60;
  uint local_5c;
  TA_ParamHolder *local_58;
  TA_FuncHandle *local_50;
  TA_Test_conflict12 *local_48;
  TA_Real *local_40;
  TA_FuncInfo *local_38;
  
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
  pTVar7 = tableTest;
  uVar4 = 0;
  do {
    if ((int)history->nbBars < pTVar7->expectedNbElement) {
      printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_rsi.c"
             ,uVar4 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    TA_SetCompatibility(pTVar7->compatibility);
    setInputBuffer(0,history->close,history->nbBars);
    setInputBuffer(1,history->close,history->nbBars);
    TVar2 = pTVar7->theFunction;
    if (TVar2 == TA_ANY_MA_TEST) {
      TVar6 = TA_FUNC_UNST_RSI;
LAB_0011ab0f:
      TVar1 = TA_SetUnstablePeriod(TVar6,pTVar7->unstablePeriod);
      if (TVar1 != TA_SUCCESS) {
        uVar5 = 0x8a;
        goto LAB_0011af37;
      }
      TVar2 = pTVar7->theFunction;
    }
    else if (TVar2 == TA_AD_TEST) {
      TVar6 = TA_FUNC_UNST_CMO;
      goto LAB_0011ab0f;
    }
    if (TVar2 == TA_AD_TEST) {
      TVar1 = TA_CMO(pTVar7->startIdx,pTVar7->endIdx,gBuffer[0].in,pTVar7->optInTimePeriod,
                     (int *)&local_5c,(int *)&local_60,gBuffer[0].out0);
    }
    else {
      TVar1 = 0x143a;
      if (TVar2 == TA_ANY_MA_TEST) {
        TVar1 = TA_RSI(pTVar7->startIdx,pTVar7->endIdx,gBuffer[0].in,pTVar7->optInTimePeriod,
                       (int *)&local_5c,(int *)&local_60,gBuffer[0].out0);
      }
    }
    EVar3 = checkDataSame(gBuffer[0].in,history->close,history->nbBars);
    if (EVar3 != TA_TEST_PASS) {
LAB_0011ae30:
      uVar5 = (ulong)EVar3;
      goto LAB_0011af37;
    }
    EVar3 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar7->expectedRetCode,local_5c,
                               pTVar7->expectedBegIdx,local_60,pTVar7->expectedNbElement,
                               pTVar7->oneOfTheExpectedOutReal0,
                               pTVar7->oneOfTheExpectedOutRealIndex0);
    if (EVar3 != TA_TEST_PASS) {
LAB_0011ae37:
      uVar5 = (ulong)EVar3;
      printf("Fail for output id=%d\n",0);
      goto LAB_0011af37;
    }
    local_60 = 0;
    local_5c = 0;
    if (pTVar7->theFunction == TA_AD_TEST) {
      TVar1 = TA_CMO(pTVar7->startIdx,pTVar7->endIdx,gBuffer[1].in,pTVar7->optInTimePeriod,
                     (int *)&local_5c,(int *)&local_60,gBuffer[1].in);
    }
    else {
      TVar1 = 0x143b;
      if (pTVar7->theFunction == TA_ANY_MA_TEST) {
        TVar1 = TA_RSI(pTVar7->startIdx,pTVar7->endIdx,gBuffer[1].in,pTVar7->optInTimePeriod,
                       (int *)&local_5c,(int *)&local_60,gBuffer[1].in);
      }
    }
    EVar3 = checkSameContent(gBuffer[0].out0,gBuffer[1].in);
    if (EVar3 != TA_TEST_PASS) goto LAB_0011ae30;
    EVar3 = checkExpectedValue(gBuffer[1].in,TVar1,pTVar7->expectedRetCode,local_5c,
                               pTVar7->expectedBegIdx,local_60,pTVar7->expectedNbElement,
                               pTVar7->oneOfTheExpectedOutReal0,
                               pTVar7->oneOfTheExpectedOutRealIndex0);
    if (EVar3 != TA_TEST_PASS) goto LAB_0011ae37;
    name = "RSI";
    if (pTVar7->theFunction != TA_ANY_MA_TEST) {
      if (pTVar7->theFunction == TA_AD_TEST) {
        name = "CMO";
        goto LAB_0011acb6;
      }
      TVar1 = 0x143c;
LAB_0011af22:
      printf("Fail: TA_GetFuncHandle with retCode = %d\n",(ulong)TVar1);
      uVar5 = 600;
LAB_0011af37:
      printf("%s Failed Test #%d (Code=%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_rsi.c"
             ,uVar4 & 0xffffffff,uVar5);
      return (ErrorNumber)uVar5;
    }
LAB_0011acb6:
    TVar1 = TA_GetFuncHandle(name,&local_50);
    if (TVar1 != TA_SUCCESS) goto LAB_0011af22;
    TVar1 = TA_GetFuncInfo(local_50,&local_38);
    if (TVar1 != TA_SUCCESS) {
      printf("Fail: TA_GetFuncInfo with retCode = %d\n",(ulong)TVar1);
      uVar5 = 0x259;
      goto LAB_0011af37;
    }
    TVar1 = TA_ParamHolderAlloc(local_50,&local_58);
    if (TVar1 != TA_SUCCESS) {
      printf("Fail: TA_ParamHolderAlloc with retCode = %d\n",(ulong)TVar1);
      uVar5 = 0x25a;
      goto LAB_0011af37;
    }
    TVar1 = TA_SetInputParamRealPtr(local_58,0,gBuffer[0].in);
    if (TVar1 != TA_SUCCESS) {
      printf("Fail: TA_SetInputParamRealPtr with retCode = %d\n",(ulong)TVar1);
      uVar5 = 0x25c;
      goto LAB_0011af37;
    }
    TVar1 = TA_SetOptInputParamInteger(local_58,0,pTVar7->optInTimePeriod);
    if (TVar1 != TA_SUCCESS) {
      printf("Fail: TA_SetOptInputParamInteger with retCode = %d\n",(ulong)TVar1);
      uVar5 = 0x25d;
      goto LAB_0011af37;
    }
    TVar1 = TA_SetOutputParamRealPtr(local_58,0,gBuffer[1].out0);
    if (TVar1 != TA_SUCCESS) {
      printf("Fail: TA_SetOutputParamRealPtr with retCode = %d\n",(ulong)TVar1);
      uVar5 = 0x25e;
      goto LAB_0011af37;
    }
    TVar1 = TA_CallFunc(local_58,pTVar7->startIdx,pTVar7->endIdx,(TA_Integer *)&local_5c,
                        (TA_Integer *)&local_60);
    if (TVar1 != TA_SUCCESS) {
      printf("Fail: TA_CallFunc with retCode = %d\n",(ulong)TVar1);
      uVar5 = 0x25f;
      goto LAB_0011af37;
    }
    TVar1 = TA_ParamHolderFree(local_58);
    if (TVar1 != TA_SUCCESS) {
      printf("Fail: TA_GetFuncHandle with retCode = %d\n",(ulong)TVar1);
      uVar5 = 0x25b;
      goto LAB_0011af37;
    }
    EVar3 = checkSameContent(gBuffer[0].out0,gBuffer[1].out0);
    if (EVar3 != TA_TEST_PASS) goto LAB_0011ae30;
    EVar3 = checkExpectedValue(gBuffer[1].out0,TA_SUCCESS,pTVar7->expectedRetCode,local_5c,
                               pTVar7->expectedBegIdx,local_60,pTVar7->expectedNbElement,
                               pTVar7->oneOfTheExpectedOutReal0,
                               pTVar7->oneOfTheExpectedOutRealIndex0);
    if (EVar3 != TA_TEST_PASS) goto LAB_0011ae37;
    local_40 = history->close;
    local_48 = pTVar7;
    if (pTVar7->doRangeTestFlag != 0) {
      if (pTVar7->theFunction == TA_ANY_MA_TEST) {
        TVar6 = TA_FUNC_UNST_RSI;
      }
      else {
        if (pTVar7->theFunction != TA_AD_TEST) goto LAB_0011ae0c;
        TVar6 = TA_FUNC_UNST_CMO;
      }
      EVar3 = doRangeTest(rangeTestFunction,TVar6,&local_48,1,0);
      if (EVar3 != TA_TEST_PASS) goto LAB_0011ae30;
    }
LAB_0011ae0c:
    uVar4 = uVar4 + 1;
    pTVar7 = pTVar7 + 1;
    if (uVar4 == 0x29) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber test_func_rsi( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__,
                 i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}